

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::INC_AB_X(CPU *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  
  this->cycles = 7;
  uVar2 = GetWord(this);
  uVar2 = this->X + uVar2;
  uVar1 = ReadByte(this,uVar2);
  this->cycles = this->cycles - 2;
  WriteByte(this,uVar2,uVar1 + 1);
  (this->field_6).ps = (this->field_6).ps & 0x7d | uVar1 + 1 & 0x80;
  return;
}

Assistant:

void CPU::INC_AB_X()
{
    cycles = 7;
    uint16_t addr = GetWord() + X, result = ReadByte(addr) + 1;
    cycles -= 2;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}